

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall
Rml::Element::AddToStackingContext
          (Element *this,Vector<StackingContextChild> *stacking_children,bool is_flex_item,
          bool is_non_dom_element)

{
  code *pcVar1;
  bool bVar2;
  Position PVar3;
  Float FVar4;
  size_type index_begin;
  byte local_5a;
  byte local_59;
  size_t index_child_begin;
  RenderOrder local_30;
  byte local_22;
  byte local_21;
  RenderOrder local_20;
  Display local_1b;
  bool render_as_atomic_unit;
  bool include_children;
  RenderOrder order;
  Display display;
  bool is_non_dom_element_local;
  bool is_flex_item_local;
  Vector<StackingContextChild> *stacking_children_local;
  Element *this_local;
  
  render_as_atomic_unit = is_non_dom_element;
  include_children = is_flex_item;
  _order = stacking_children;
  stacking_children_local = (Vector<StackingContextChild> *)this;
  bVar2 = IsVisible(this,false);
  if (bVar2) {
    local_1b = GetDisplay(this);
    local_20 = Inline;
    local_21 = 1;
    local_22 = 0;
    if ((this->local_stacking_context & 1U) == 0) {
      if ((((local_1b == TableRow) || (local_1b == TableRowGroup)) || (local_1b == TableColumn)) ||
         (local_1b == TableColumnGroup)) {
        switch(local_1b) {
        case TableRow:
          local_20 = TableRow;
          break;
        case TableRowGroup:
          local_20 = TableRowGroup;
          break;
        case TableColumn:
          local_20 = TableColumn;
          break;
        case TableColumnGroup:
          local_20 = TableColumnGroup;
        }
      }
      else {
        PVar3 = GetPosition(this);
        if (PVar3 == Static) {
          FVar4 = GetFloat(this);
          if (FVar4 == None) {
            switch(local_1b) {
            case None:
            case TableRow:
            case TableRowGroup:
            case TableColumn:
            case TableColumnGroup:
              bVar2 = Assert("RMLUI_ERROR",
                             "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                             ,0x978);
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              break;
            case Block:
            case FlowRoot:
            case Flex:
            case Table:
              local_20 = Block;
              local_59 = 1;
              if (local_1b != Table) {
                local_59 = include_children;
              }
              local_22 = local_59 & 1;
              break;
            case Inline:
            case InlineBlock:
            case InlineFlex:
            case InlineTable:
              local_20 = Inline;
              local_5a = 1;
              if (local_1b == Inline) {
                local_5a = include_children;
              }
              local_22 = local_5a & 1;
              break;
            case TableCell:
              local_20 = TableCell;
              local_22 = 1;
            }
          }
          else {
            local_20 = Floating;
            local_22 = 1;
          }
        }
        else {
          local_20 = Positioned;
          local_22 = 1;
        }
      }
    }
    else {
      if (this->z_index <= 0.0) {
        if (0.0 < this->z_index || this->z_index == 0.0) {
          local_20 = Positioned;
        }
        else {
          local_20 = StackNegative;
        }
      }
      else {
        local_20 = StackPositive;
      }
      local_21 = 0;
    }
    if ((render_as_atomic_unit & 1U) != 0) {
      local_22 = 1;
    }
    local_30 = local_20;
    index_child_begin = (size_t)this;
    ::std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>::push_back
              (_order,(value_type *)&index_child_begin);
    if (((local_21 & 1) != 0) &&
       (bVar2 = ::std::
                vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                ::empty(&this->children), !bVar2)) {
      index_begin = ::std::
                    vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>::
                    size(_order);
      AddChildrenToStackingContext(this,_order);
      if ((local_22 & 1) != 0) {
        StackingContext_MakeAtomicRange(_order,index_begin,local_20);
      }
    }
  }
  return;
}

Assistant:

void Element::AddToStackingContext(Vector<StackingContextChild>& stacking_children, bool is_flex_item, bool is_non_dom_element)
{
	using Style::Display;

	if (!IsVisible())
		return;

	const Display display = GetDisplay();

	RenderOrder order = RenderOrder::Inline;
	bool include_children = true;
	bool render_as_atomic_unit = false;

	if (local_stacking_context)
	{
		if (z_index > 0.f)
			order = RenderOrder::StackPositive;
		else if (z_index < 0.f)
			order = RenderOrder::StackNegative;
		else
			order = RenderOrder::Positioned;

		include_children = false;
	}
	else if (display == Display::TableRow || display == Display::TableRowGroup || display == Display::TableColumn ||
		display == Display::TableColumnGroup)
	{
		// Handle internal display values taking priority over position and float.
		switch (display)
		{
		case Display::TableRow: order = RenderOrder::TableRow; break;
		case Display::TableRowGroup: order = RenderOrder::TableRowGroup; break;
		case Display::TableColumn: order = RenderOrder::TableColumn; break;
		case Display::TableColumnGroup: order = RenderOrder::TableColumnGroup; break;
		default: break;
		}
	}
	else if (GetPosition() != Style::Position::Static)
	{
		order = RenderOrder::Positioned;
		render_as_atomic_unit = true;
	}
	else if (GetFloat() != Style::Float::None)
	{
		order = RenderOrder::Floating;
		render_as_atomic_unit = true;
	}
	else
	{
		switch (display)
		{
		case Display::Block:
		case Display::FlowRoot:
		case Display::Table:
		case Display::Flex:
			order = RenderOrder::Block;
			render_as_atomic_unit = (display == Display::Table || is_flex_item);
			break;

		case Display::Inline:
		case Display::InlineBlock:
		case Display::InlineFlex:
		case Display::InlineTable:
			order = RenderOrder::Inline;
			render_as_atomic_unit = (display != Display::Inline || is_flex_item);
			break;

		case Display::TableCell:
			order = RenderOrder::TableCell;
			render_as_atomic_unit = true;
			break;

		case Display::TableRow:
		case Display::TableRowGroup:
		case Display::TableColumn:
		case Display::TableColumnGroup:
		case Display::None: RMLUI_ERROR; break; // Handled above.
		}
	}

	if (is_non_dom_element)
		render_as_atomic_unit = true;

	stacking_children.push_back(StackingContextChild{this, order});

	if (include_children && !children.empty())
	{
		const size_t index_child_begin = stacking_children.size();

		AddChildrenToStackingContext(stacking_children);

		if (render_as_atomic_unit)
			StackingContext_MakeAtomicRange(stacking_children, index_child_begin, order);
	}
}